

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

Texture * rw::gl3::readNativeTexture(Stream *stream)

{
  bool bVar1;
  uint32 uVar2;
  int32 width;
  int32 height;
  int32 depth;
  int iVar3;
  int32 iVar4;
  uint uVar5;
  Texture *this;
  Raster *this_00;
  uint8 *puVar6;
  char *pcVar7;
  ulong uVar8;
  int level;
  FILE *__stream;
  Error _e;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    uVar2 = Stream::readU32(stream);
    if (uVar2 == 0xc) {
      this = Texture::create((Raster *)0x0);
      if (this == (Texture *)0x0) {
        return (Texture *)0x0;
      }
      uVar2 = Stream::readU32(stream);
      this->filterAddressing = uVar2;
      (*stream->_vptr_Stream[4])(stream,this->name,0x20);
      (*stream->_vptr_Stream[4])(stream,this->mask,0x20);
      uVar2 = Stream::readU32(stream);
      width = Stream::readI32(stream);
      height = Stream::readI32(stream);
      depth = Stream::readI32(stream);
      iVar3 = Stream::readI32(stream);
      iVar4 = Stream::readI32(stream);
      uVar5 = Stream::readI32(stream);
      Stream::readI32(stream);
      if (iVar4 == gl3Caps) {
        if ((uVar5 & 2) == 0) {
          uVar5 = 4;
        }
        else {
          uVar5 = 0x84;
          if (DAT_00146310 == '\0') {
            Texture::destroy(this);
            _e.plugin = 0xb00;
            _e.code = 0x8000000c;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/gl3raster.cpp"
                    ,0x3a6);
            __stream = _stderr;
            pcVar7 = dbgsprint(0x8000000c);
            goto LAB_0011543a;
          }
        }
        this_00 = Raster::create(width,height,depth,uVar2 | uVar5,0xc);
        this->raster = this_00;
        level = 0;
        if (iVar3 < 1) {
          iVar3 = level;
        }
        for (; iVar3 != level; level = level + 1) {
          uVar2 = Stream::readU32(stream);
          puVar6 = Raster::lock(this_00,level,5);
          (*stream->_vptr_Stream[4])(stream,puVar6,(ulong)uVar2);
          Raster::unlock(this_00,level);
        }
        return this;
      }
      Texture::destroy(this);
      _e.plugin = 0xb00;
      _e.code = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/gl3raster.cpp"
              ,0x39d);
      uVar8 = 0xc;
    }
    else {
      _e.plugin = 0xb00;
      _e.code = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/gl3raster.cpp"
              ,899);
      uVar8 = (ulong)uVar2;
    }
    __stream = _stderr;
    pcVar7 = dbgsprint(0x80000006,uVar8);
  }
  else {
    _e.plugin = 0xb00;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/gl3raster.cpp"
            ,0x37e);
    __stream = _stderr;
    pcVar7 = dbgsprint(0x80000004,"STRUCT");
  }
LAB_0011543a:
  fprintf(__stream,"%s\n",pcVar7);
  setError(&_e);
  return (Texture *)0x0;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_GL3){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;

	// Texture
	tex->filterAddressing = stream->readU32();
	stream->read8(tex->name, 32);
	stream->read8(tex->mask, 32);

	// Raster
	uint32 format = stream->readU32();
	int32 width = stream->readI32();
	int32 height = stream->readI32();
	int32 depth = stream->readI32();
	int32 numLevels = stream->readI32();

	// Native raster
	int32 subplatform = stream->readI32();
	int32 flags = stream->readI32();
	int32 compression = stream->readI32();

	if(subplatform != gl3Caps.gles){
		tex->destroy();
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}

	Raster *raster;
	Gl3Raster *natras;
	if(flags & 2){
		if(!gl3Caps.dxtSupported){
			tex->destroy();
			RWERROR((ERR_FORMAT_UNSUPPORTED));
			return nil;
		}
		raster = Raster::create(width, height, depth, format | Raster::TEXTURE | Raster::DONTALLOCATE, PLATFORM_GL3);
		allocateDXT(raster, compression, numLevels, flags & 1);
	}else{
		raster = Raster::create(width, height, depth, format | Raster::TEXTURE, PLATFORM_GL3);
	}
	assert(raster);
	natras = GETGL3RASTEREXT(raster);
	tex->raster = raster;

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = stream->readU32();
		data = raster->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		stream->read8(data, size);
		raster->unlock(i);
	}
	return tex;
}